

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Span.h
# Opt level: O2

void __thiscall jaegertracing::Span::Span(Span *this,Span *span)

{
  SpanContext local_e0;
  
  *(undefined **)this = &std::bad_alloc::vtable;
  *(undefined8 *)(this + 8) = 0;
  *(undefined8 *)(this + 0x10) = 0;
  SpanContext::SpanContext((SpanContext *)(this + 0x18));
  *(Span **)(this + 200) = this + 0xd8;
  *(undefined8 *)(this + 0xd0) = 0;
  this[0xd8] = (Span)0x0;
  *(undefined8 *)(this + 0xe8) = 0;
  *(undefined8 *)(this + 0xf0) = 0;
  *(undefined8 *)(this + 0x100) = 0;
  *(undefined8 *)(this + 0x108) = 0;
  *(undefined8 *)(this + 0x110) = 0;
  *(undefined8 *)(this + 0x118) = 0;
  *(undefined8 *)(this + 0x120) = 0;
  *(undefined8 *)(this + 0x128) = 0;
  *(undefined8 *)(this + 0x130) = 0;
  *(undefined8 *)(this + 0x138) = 0;
  *(undefined8 *)(this + 0x140) = 0;
  *(undefined8 *)(this + 0x148) = 0;
  *(undefined8 *)(this + 0x150) = 0;
  *(undefined8 *)(this + 0x158) = 0;
  *(undefined8 *)(this + 0x160) = 0;
  *(undefined8 *)(this + 0x168) = 0;
  std::lock<std::mutex,std::mutex>
            ((mutex *)&((pthread_mutex_t *)(this + 0x148))->__data,
             (mutex *)&((pthread_mutex_t *)(span + 0x148))->__data);
  std::__shared_ptr<const_jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<const_jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2> *)(this + 8),
             (__shared_ptr<const_jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2> *)(span + 8));
  SpanContext::SpanContext(&local_e0,(SpanContext *)(span + 0x18));
  SpanContext::swap((SpanContext *)(this + 0x18),&local_e0);
  SpanContext::~SpanContext(&local_e0);
  std::__cxx11::string::_M_assign((string *)(this + 200));
  *(undefined8 *)(this + 0xe8) = *(undefined8 *)(span + 0xe8);
  *(undefined8 *)(this + 0xf0) = *(undefined8 *)(span + 0xf0);
  *(undefined8 *)(this + 0xf8) = *(undefined8 *)(span + 0xf8);
  std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::operator=
            ((vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *)(this + 0x100),
             (vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *)(span + 0x100));
  std::vector<jaegertracing::LogRecord,_std::allocator<jaegertracing::LogRecord>_>::operator=
            ((vector<jaegertracing::LogRecord,_std::allocator<jaegertracing::LogRecord>_> *)
             (this + 0x118),
             (vector<jaegertracing::LogRecord,_std::allocator<jaegertracing::LogRecord>_> *)
             (span + 0x118));
  std::vector<jaegertracing::Reference,_std::allocator<jaegertracing::Reference>_>::operator=
            ((vector<jaegertracing::Reference,_std::allocator<jaegertracing::Reference>_> *)
             (this + 0x130),
             (vector<jaegertracing::Reference,_std::allocator<jaegertracing::Reference>_> *)
             (span + 0x130));
  pthread_mutex_unlock((pthread_mutex_t *)(span + 0x148));
  pthread_mutex_unlock((pthread_mutex_t *)(this + 0x148));
  return;
}

Assistant:

Span(const Span& span)
    {
        std::lock(_mutex, span._mutex);
        std::lock_guard<std::mutex> lock(_mutex, std::adopt_lock);
        std::lock_guard<std::mutex> spanLock(span._mutex, std::adopt_lock);

        _tracer = span._tracer;
        _context = span._context;
        _operationName = span._operationName;
        _startTimeSystem = span._startTimeSystem;
        _startTimeSteady = span._startTimeSteady;
        _duration = span._duration;
        _tags = span._tags;
        _logs = span._logs;
        _references = span._references;
    }